

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

bool google::ParseDiscriminator(State *state)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  short sVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  State copy;
  char *pcVar11;
  
  pcVar1 = state->mangled_cur;
  pcVar2 = state->out_cur;
  pcVar3 = state->out_begin;
  pcVar4 = state->out_end;
  pcVar5 = state->prev_name;
  iVar6 = state->prev_name_length;
  sVar7 = state->nest_level;
  bVar8 = state->append;
  bVar9 = state->overflowed;
  pcVar11 = state->mangled_cur;
  if (*pcVar11 == '_') {
    state->mangled_cur = pcVar11 + 1;
    bVar10 = ParseNumber(state,(int *)0x0);
    pcVar11 = (char *)(ulong)bVar10;
    if (bVar10) {
      return bVar10;
    }
  }
  state->out_begin = pcVar3;
  state->out_end = pcVar4;
  state->prev_name = pcVar5;
  state->prev_name_length = iVar6;
  state->nest_level = sVar7;
  state->append = bVar8;
  state->overflowed = bVar9;
  state->mangled_cur = pcVar1;
  state->out_cur = pcVar2;
  state->out_begin = pcVar3;
  state->out_end = pcVar4;
  return (bool)(char)pcVar11;
}

Assistant:

static bool ParseDiscriminator(State *state) {
  State copy = *state;
  if (ParseOneCharToken(state, '_') && ParseNumber(state, NULL)) {
    return true;
  }
  *state = copy;
  return false;
}